

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

void __thiscall psy::C::Lexer::lexBackslash(Lexer *this,SyntaxKind syntaxK)

{
  int iVar1;
  bool bVar2;
  SyntaxKind syntaxK_local;
  Lexer *this_local;
  
  yyinput(this);
  if ((this->yychar_ == '\0') || (iVar1 = isspace((uint)this->yychar_), iVar1 != 0)) {
    while( true ) {
      bVar2 = false;
      if (this->yychar_ != '\n') {
        iVar1 = isspace((uint)this->yychar_);
        bVar2 = iVar1 != 0;
      }
      if (!bVar2) break;
      yyinput(this);
    }
    if (this->yychar_ == '\0') {
      this->syntaxK_splitTk = syntaxK;
      this->withinLogicalLine_ = true;
    }
    else if (this->yychar_ == '\n') {
      yyinput(this);
      while( true ) {
        bVar2 = false;
        if (this->yychar_ != '\n') {
          iVar1 = isspace((uint)this->yychar_);
          bVar2 = iVar1 != 0;
        }
        if (!bVar2) break;
        yyinput(this);
      }
      if (this->yychar_ == '\0') {
        this->syntaxK_splitTk = syntaxK;
      }
    }
  }
  else {
    yyinput(this);
  }
  return;
}

Assistant:

void Lexer::lexBackslash(SyntaxKind syntaxK)
{
    yyinput();
    if (yychar_ && !std::isspace(yychar_)) {
        yyinput();
        return;
    }

    while (yychar_ != '\n' && std::isspace(yychar_))
        yyinput();

    if (!yychar_) {
        syntaxK_splitTk = syntaxK;
        withinLogicalLine_ = true;
        return;
    }

    if (yychar_ == '\n') {
        yyinput();
        while (yychar_ != '\n' && std::isspace(yychar_))
            yyinput();

        if (!yychar_)
            syntaxK_splitTk = syntaxK;
    }
}